

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void scaling_clear(CUPDLPscaling *scaling)

{
  if (scaling != (CUPDLPscaling *)0x0) {
    if (scaling->colScale != (cupdlp_float *)0x0) {
      free(scaling->colScale);
      scaling->colScale = (cupdlp_float *)0x0;
    }
    if (scaling->rowScale != (cupdlp_float *)0x0) {
      free(scaling->rowScale);
      scaling->rowScale = (cupdlp_float *)0x0;
    }
    free(scaling);
    return;
  }
  return;
}

Assistant:

void scaling_clear(CUPDLPscaling *scaling) {
  if (scaling) {
    if (scaling->colScale) {
      cupdlp_free(scaling->colScale);
    }
    if (scaling->rowScale) {
      cupdlp_free(scaling->rowScale);
    }
    cupdlp_free(scaling);
  }
}